

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

xmlBufferPtr xmlBufferCreateSize(size_t size)

{
  xmlBufferPtr pxVar1;
  xmlChar *pxVar2;
  uint uVar3;
  
  if ((size < 0x7fffffff) &&
     (pxVar1 = (xmlBufferPtr)(*xmlMalloc)(0x20), pxVar1 != (xmlBufferPtr)0x0)) {
    pxVar1->use = 0;
    pxVar1->alloc = XML_BUFFER_ALLOC_IO;
    uVar3 = (int)size + 1;
    if (size == 0) {
      uVar3 = 0;
    }
    pxVar1->size = uVar3;
    if (size == 0) {
      pxVar1->contentIO = (xmlChar *)0x0;
      pxVar1->content = (xmlChar *)0x0;
      return pxVar1;
    }
    pxVar2 = (xmlChar *)(*xmlMalloc)((size_t)uVar3);
    pxVar1->contentIO = pxVar2;
    if (pxVar2 != (xmlChar *)0x0) {
      pxVar1->content = pxVar2;
      *pxVar2 = '\0';
      return pxVar1;
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlBufferPtr)0x0;
}

Assistant:

xmlBufferPtr
xmlBufferCreateSize(size_t size) {
    xmlBufferPtr ret;

    if (size >= INT_MAX)
        return(NULL);

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
        return(NULL);

    ret->use = 0;
    ret->alloc = XML_BUFFER_ALLOC_IO;
    ret->size = (size ? size + 1 : 0);         /* +1 for ending null */

    if (ret->size) {
        ret->contentIO = xmlMalloc(ret->size);
        if (ret->contentIO == NULL) {
            xmlFree(ret);
            return(NULL);
        }
        ret->content = ret->contentIO;
        ret->content[0] = 0;
    } else {
        ret->contentIO = NULL;
	ret->content = NULL;
    }

    return(ret);
}